

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::FreezeImpl
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,bool isConvertedType)

{
  BOOL BVar1;
  DictionaryTypeHandler *this_00;
  bool isConvertedType_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  this_00 = ConvertToDictionaryType(this,instance);
  BVar1 = DynamicTypeHandler::Freeze(&this_00->super_DynamicTypeHandler,instance,true);
  return BVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        return ConvertToDictionaryType(instance)->Freeze(instance, true);
    }